

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkLayer::set_allocated_broadcasttostatic
          (NeuralNetworkLayer *this,BroadcastToStaticLayerParams *broadcasttostatic)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  BroadcastToStaticLayerParams *broadcasttostatic_local;
  NeuralNetworkLayer *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_layer(this);
  if (broadcasttostatic != (BroadcastToStaticLayerParams *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::BroadcastToStaticLayerParams>::GetOwningArena
                   (broadcasttostatic);
    message_arena = (Arena *)broadcasttostatic;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::BroadcastToStaticLayerParams>
                              (message_arena_00,broadcasttostatic,submessage_arena_00);
    }
    set_has_broadcasttostatic(this);
    (this->layer_).convolution_ = (ConvolutionLayerParams *)message_arena;
  }
  return;
}

Assistant:

void NeuralNetworkLayer::set_allocated_broadcasttostatic(::CoreML::Specification::BroadcastToStaticLayerParams* broadcasttostatic) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_layer();
  if (broadcasttostatic) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::BroadcastToStaticLayerParams>::GetOwningArena(broadcasttostatic);
    if (message_arena != submessage_arena) {
      broadcasttostatic = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, broadcasttostatic, submessage_arena);
    }
    set_has_broadcasttostatic();
    layer_.broadcasttostatic_ = broadcasttostatic;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.NeuralNetworkLayer.broadcastToStatic)
}